

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

int __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
MemSegment::init(MemSegment *this,EVP_PKEY_CTX *ctx)

{
  MemChunk *chunk;
  size_type chunkSize;
  size_type segSize_local;
  MemSegment *this_local;
  
  this->m_size = (size_type)ctx;
  this->m_pad = 1;
  MemChunk::setFreeChunkSize((MemChunk *)&this->m_pad,(size_type)(ctx + -0x18));
  return (int)&this->m_pad;
}

Assistant:

MemChunk*
        init (size_type segSize)
        {
            m_size = segSize;
            m_pad = MemChunk::BIT_USED;

            // We do not initiate m_next since it will be assigned
            // by the caller anyways.

            size_type  chunkSize = segSize - SEGMENT_OVERHEAD;
            MemChunk* chunk = (MemChunk*)(((char*)this) + offsetof (MemSegment, m_pad));
            chunk->setFreeChunkSize (chunkSize);
            return chunk;
        }